

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenBoundingBoxesProcess.cpp
# Opt level: O1

void __thiscall
Assimp::GenBoundingBoxesProcess::Execute(GenBoundingBoxesProcess *this,aiScene *pScene)

{
  aiMesh *mesh;
  ulong uVar1;
  aiVector3D max;
  aiVector3D min;
  aiVector3D local_48;
  aiVector3D local_3c;
  
  if ((pScene != (aiScene *)0x0) && (pScene->mNumMeshes != 0)) {
    uVar1 = 0;
    do {
      mesh = pScene->mMeshes[uVar1];
      if (mesh != (aiMesh *)0x0) {
        local_3c.x = 999999.0;
        local_3c.y = 999999.0;
        local_3c.z = 999999.0;
        local_48.x = -999999.0;
        local_48.y = -999999.0;
        local_48.z = -999999.0;
        checkMesh(mesh,&local_3c,&local_48);
        (mesh->mAABB).mMin.z = local_3c.z;
        (mesh->mAABB).mMin.x = local_3c.x;
        (mesh->mAABB).mMin.y = local_3c.y;
        (mesh->mAABB).mMax.x = local_48.x;
        (mesh->mAABB).mMax.y = local_48.y;
        (mesh->mAABB).mMax.z = local_48.z;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < pScene->mNumMeshes);
  }
  return;
}

Assistant:

void GenBoundingBoxesProcess::Execute(aiScene* pScene) {
    if (nullptr == pScene) {
        return;
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh* mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        aiVector3D min(999999, 999999, 999999), max(-999999, -999999, -999999);
        checkMesh(mesh, min, max);
        mesh->mAABB.mMin = min;
        mesh->mAABB.mMax = max;
    }
}